

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RendererTests::RenderingSingleCellsPreservesRenditionPositions(RendererTests *this)

{
  int *piVar1;
  pointer psVar2;
  int iVar3;
  int x;
  int iVar4;
  int *piVar5;
  int cover_00;
  int cover;
  int iVar6;
  uint uVar7;
  cell cells2 [1];
  scanline_mockup sl2;
  scanline_mockup sl1;
  cell cells1 [1];
  string local_f0;
  pointer local_d0;
  LocationInfo local_c8;
  int local_a0 [4];
  scanline_mockup local_90;
  scanline_mockup local_68;
  int local_40 [4];
  
  local_68.excepted_y = -1000000;
  local_68.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar6 = 0;
  local_68.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._inprogress = true;
  local_68._current_y = 0x7fffffff;
  local_90.excepted_y = -1000000;
  local_90.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._inprogress = true;
  local_90._current_y = 0x7fffffff;
  local_40[2] = 0;
  local_40[0] = 7;
  local_40[1] = 0x1400;
  local_a0[2] = 0;
  local_a0[0] = 0x13d62b;
  local_a0[1] = 0x1600;
  iVar4 = 7;
  piVar5 = local_40;
  do {
    iVar3 = 0;
    do {
      piVar1 = piVar5;
      piVar5 = piVar1 + 3;
      iVar3 = iVar3 + piVar1[1];
      iVar6 = iVar6 + piVar1[2];
      if (piVar1 == local_40) break;
    } while (*piVar5 == iVar4);
    cover_00 = iVar6 * 0x200;
    x = iVar4;
    if (iVar3 != 0) {
      anon_unknown_1::scanline_mockup::add_cell(&local_68,iVar4,cover_00 - iVar3);
      x = iVar4 + 1;
    }
    if (piVar1 == local_40) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_c8,&local_f0,0x65);
      psVar2 = local_68.spans_log.
               super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                ((ut *)&DAT_001a0d70,
                 (span (*) [1])
                 local_68.spans_log.
                 super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                  *)local_68.spans_log.
                    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                    ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.filename._M_dataplus._M_p != &local_c8.filename.field_2) {
        operator_delete(local_c8.filename._M_dataplus._M_p);
      }
      local_d0 = psVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      uVar7 = 0;
      piVar5 = local_a0;
      do {
        iVar4 = *piVar5;
        iVar6 = 0;
        do {
          piVar1 = piVar5;
          piVar5 = piVar1 + 3;
          iVar6 = iVar6 + piVar1[1];
          uVar7 = uVar7 + piVar1[2];
          if (piVar1 == local_a0) break;
        } while (*piVar5 == iVar4);
        if (iVar6 != 0) {
          anon_unknown_1::scanline_mockup::add_cell(&local_90,iVar4,uVar7 * 0x200 - iVar6);
          iVar4 = iVar4 + 1;
        }
        if (piVar1 == local_a0) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                     ,"");
          ut::LocationInfo::LocationInfo(&local_c8,&local_f0,0x6d);
          psVar2 = local_90.spans_log.
                   super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ut::
          are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                    ((ut *)&DAT_001a0d80,
                     (span (*) [1])
                     local_90.spans_log.
                     super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                      *)local_90.spans_log.
                        super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.filename._M_dataplus._M_p != &local_c8.filename.field_2) {
            operator_delete(local_c8.filename._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if (psVar2 != (pointer)0x0) {
            operator_delete(psVar2);
          }
          if (local_d0 != (pointer)0x0) {
            operator_delete(local_d0);
          }
          return;
        }
        if ((uVar7 & 0x7fffff) != 0 && *piVar5 - iVar4 != 0) {
          anon_unknown_1::scanline_mockup::add_span(&local_90,iVar4,*piVar5 - iVar4,uVar7 * 0x200);
        }
      } while( true );
    }
    iVar4 = *piVar5;
    if (cover_00 != 0 && iVar4 - x != 0) {
      anon_unknown_1::scanline_mockup::add_span(&local_68,x,iVar4 - x,cover_00);
      iVar4 = *piVar5;
    }
  } while( true );
}

Assistant:

test( RenderingSingleCellsPreservesRenditionPositions )
			{
				// INIT
				scanline_mockup sl1, sl2;
				mocks::cell cells1[] = { { 7, 10 * 512, 0 }, }, cells2[] = { { 1300011, 11 * 512, 0 }, };

				// ACT
				sweep_scanline<8>(sl1, begin(cells1), end(cells1), bypass_alpha());

				// ASSERT
				span reference1[] = { { 0x7fffffff, 7, 0, -10 * 512 }, };

				assert_equal(reference1, sl1.spans_log);

				// ACT
				sweep_scanline<8>(sl2, begin(cells2), end(cells2), bypass_alpha());

				// ASSERT
				span reference2[] = { { 0x7fffffff, 1300011, 0, -11 * 512 }, };

				assert_equal(reference2, sl2.spans_log);
			}